

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutMerge(If_Man_t *p,If_Cut_t *pCut0,If_Cut_t *pCut1,If_Cut_t *pCut)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar2 = *(uint *)&pCut0->field_0x1c;
  uVar6 = uVar2 >> 0x18;
  bVar1 = pCut1->field_0x1f;
  uVar7 = 0;
  uVar4 = (ulong)uVar6;
  do {
    if (uVar7 == bVar1) {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        (&pCut[1].Area)[uVar7] = (&pCut0[1].Area)[uVar7];
      }
      pCut->field_0x1f = (char)uVar4;
      pCut->uSign = pCut1->uSign | pCut0->uSign;
      return 1;
    }
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if ((&pCut1[1].Area)[uVar7] == (&pCut0[1].Area)[uVar5]) {
        p->pPerm[1][uVar7] = (int)uVar5;
        goto LAB_006fd359;
      }
    }
    uVar3 = (uint)uVar4;
    if (uVar3 == (uVar2 >> 0x10 & 0xff)) {
      return 0;
    }
    p->pPerm[1][uVar7] = uVar3;
    uVar4 = (ulong)(uVar3 + 1);
    (&pCut[1].Area)[(int)uVar3] = (&pCut1[1].Area)[uVar7];
LAB_006fd359:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int If_CutMerge( If_Man_t * p, If_Cut_t * pCut0, If_Cut_t * pCut1, If_Cut_t * pCut )
{ 
    int nLutSize = pCut0->nLimit;
    int nSize0 = pCut0->nLeaves;
    int nSize1 = pCut1->nLeaves;
    int * pC0 = pCut0->pLeaves;
    int * pC1 = pCut1->pLeaves;
    int * pC = pCut->pLeaves;
    int i, k, c;
    // compare two cuts with different numbers
    c = nSize0; 
    for ( i = 0; i < nSize1; i++ )
    {
        for ( k = 0; k < nSize0; k++ )
            if ( pC1[i] == pC0[k] )
                break;
        if ( k < nSize0 )
        {
            p->pPerm[1][i] = k;
            continue;
        }
        if ( c == nLutSize )
            return 0;
        p->pPerm[1][i] = c;
        pC[c++] = pC1[i];
    }
    for ( i = 0; i < nSize0; i++ )
        pC[i] = pC0[i];
    pCut->nLeaves = c;
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    return 1;
}